

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpression.cxx
# Opt level: O0

void cmGeneratorExpression::Split
               (string *input,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *output)

{
  bool bVar1;
  long lVar2;
  ulong uVar3;
  long lVar4;
  string_view arg;
  string local_180 [32];
  string_view local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  char *local_f0;
  size_type traversed;
  char *cStart;
  char *c;
  undefined1 auStack_d0 [4];
  int nestingLevel;
  char *local_c8;
  string local_c0 [32];
  string local_a0 [48];
  ulong local_70;
  size_type startPos;
  string preGenex;
  string part;
  size_type lastPos;
  size_type pos;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *output_local;
  string *input_local;
  
  part.field_2._8_8_ = 0;
LAB_00576ed3:
  lVar2 = std::__cxx11::string::find((char *)input,0xc118d0);
  if (lVar2 == -1) {
    uVar3 = std::__cxx11::string::size();
    if ((ulong)part.field_2._8_8_ < uVar3) {
      std::__cxx11::string::substr((ulong)local_180,(ulong)input);
      local_160 = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view(local_180);
      cmExpandList(local_160,output,false);
      std::__cxx11::string::~string(local_180);
    }
    return;
  }
  std::__cxx11::string::substr((ulong)((long)&preGenex.field_2 + 8),(ulong)input);
  std::__cxx11::string::string((string *)&startPos);
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    local_70 = std::__cxx11::string::rfind((char)input,0x3b);
    if (local_70 == 0xffffffffffffffff) {
      std::__cxx11::string::operator=
                ((string *)&startPos,(string *)(preGenex.field_2._M_local_buf + 8));
      std::__cxx11::string::clear();
    }
    else if ((local_70 != lVar2 - 1U) && ((ulong)part.field_2._8_8_ <= local_70)) {
      std::__cxx11::string::substr((ulong)local_a0,(ulong)input);
      std::__cxx11::string::operator=((string *)(preGenex.field_2._M_local_buf + 8),local_a0);
      std::__cxx11::string::~string(local_a0);
      std::__cxx11::string::substr((ulong)local_c0,(ulong)input);
      std::__cxx11::string::operator=((string *)&startPos,local_c0);
      std::__cxx11::string::~string(local_c0);
    }
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) {
      arg = (string_view)
            std::__cxx11::string::operator_cast_to_basic_string_view
                      ((string *)(preGenex.field_2._M_local_buf + 8));
      _auStack_d0 = arg;
      cmExpandList(arg,output,false);
    }
  }
  c._4_4_ = 1;
  lVar4 = std::__cxx11::string::c_str();
  traversed = lVar4 + lVar2 + 2;
  for (cStart = (char *)traversed; *cStart != '\0'; cStart = cStart + 1) {
    bVar1 = StartsWithGeneratorExpression(cStart);
    if (bVar1) {
      c._4_4_ = c._4_4_ + 1;
      cStart = cStart + 1;
    }
    else if ((*cStart == '>') && (c._4_4_ = c._4_4_ + -1, c._4_4_ == 0)) break;
  }
  do {
    if (*cStart == '\0') break;
    if (*cStart == ';') {
      cStart = cStart + -1;
      break;
    }
    cStart = cStart + 1;
  } while( true );
  local_f0 = cStart + (1 - traversed);
  std::operator+(&local_130,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&startPos,"$<"
                );
  std::__cxx11::string::substr((ulong)&local_150,(ulong)input);
  std::operator+(&local_110,&local_130,&local_150);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(output,&local_110);
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::~string((string *)&local_150);
  std::__cxx11::string::~string((string *)&local_130);
  part.field_2._8_8_ = local_f0 + lVar2 + 2;
  std::__cxx11::string::~string((string *)&startPos);
  std::__cxx11::string::~string((string *)(preGenex.field_2._M_local_buf + 8));
  goto LAB_00576ed3;
}

Assistant:

void cmGeneratorExpression::Split(const std::string& input,
                                  std::vector<std::string>& output)
{
  std::string::size_type pos = 0;
  std::string::size_type lastPos = pos;
  while ((pos = input.find("$<", lastPos)) != std::string::npos) {
    std::string part = input.substr(lastPos, pos - lastPos);
    std::string preGenex;
    if (!part.empty()) {
      std::string::size_type startPos = input.rfind(';', pos);
      if (startPos == std::string::npos) {
        preGenex = part;
        part.clear();
      } else if (startPos != pos - 1 && startPos >= lastPos) {
        part = input.substr(lastPos, startPos - lastPos);
        preGenex = input.substr(startPos + 1, pos - startPos - 1);
      }
      if (!part.empty()) {
        cmExpandList(part, output);
      }
    }
    pos += 2;
    int nestingLevel = 1;
    const char* c = input.c_str() + pos;
    const char* const cStart = c;
    for (; *c; ++c) {
      if (cmGeneratorExpression::StartsWithGeneratorExpression(c)) {
        ++nestingLevel;
        ++c;
        continue;
      }
      if (c[0] == '>') {
        --nestingLevel;
        if (nestingLevel == 0) {
          break;
        }
      }
    }
    for (; *c; ++c) {
      // Capture the part after the genex and before the next ';'
      if (c[0] == ';') {
        --c;
        break;
      }
    }
    const std::string::size_type traversed = (c - cStart) + 1;
    output.push_back(preGenex + "$<" + input.substr(pos, traversed));
    pos += traversed;
    lastPos = pos;
  }
  if (lastPos < input.size()) {
    cmExpandList(input.substr(lastPos), output);
  }
}